

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

int diy::io::utils::close(int __fd)

{
  int iVar1;
  
  fsync(__fd);
  iVar1 = ::close(__fd);
  return iVar1;
}

Assistant:

inline void close(int fd)
  {
#if defined(_WIN32)
    _close(fd);
#else
    fsync(fd);
    ::close(fd);
#endif
  }